

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_miniscript_and_b
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  uchar append;
  size_t indexes [2];
  
  append = 0x9a;
  indexes[0] = 0;
  indexes[1] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,indexes,(uchar *)0x0,0,(uchar *)0x0,0,
                     (uchar *)0x0,0,&append,1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_and_b(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char append = OP_BOOLAND;
    const size_t indexes[] = {0, 1};
    /* [X] [Y] BOOLAND */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        NULL,
        0,
        NULL,
        0,
        NULL,
        0,
        &append,
        1,
        script,
        script_len,
        write_len);
}